

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void get_phys_addr_pmsav7_default
               (CPUARMState_conflict *env,ARMMMUIdx mmu_idx,int32_t address,int *prot)

{
  uint uVar1;
  uint64_t uVar2;
  uint uVar3;
  
  if ((env->features & 0x200) == 0) {
    *prot = 3;
    if ((uint)address < 0xf0000000) {
      if (address < 0) {
        return;
      }
      uVar1 = 7;
    }
    else {
      uVar2 = regime_sctlr(env,mmu_idx);
      if (((uint)uVar2 >> 0xd & 1) == 0) {
        return;
      }
      uVar1 = *prot | 4;
    }
  }
  else {
    uVar1 = 7;
    if ((((0x3fffffff < address + 0xa0000000U) && (0x1fffffff < (uint)address)) &&
        (uVar3 = address & 0xe0000000, uVar3 != 0x20000000)) &&
       (((uVar1 = 3, (uint)address < 0xe0000000 && (uVar3 != 0xc0000000)) &&
        ((address < 0x40000000 && (uVar3 != 0xa0000000)))))) {
      return;
    }
  }
  *prot = uVar1;
  return;
}

Assistant:

static inline void get_phys_addr_pmsav7_default(CPUARMState *env,
                                                ARMMMUIdx mmu_idx,
                                                int32_t address, int *prot)
{
#define XRANGE(a, x, y) (a >=x && a <= y)
    if (!arm_feature(env, ARM_FEATURE_M)) {
        *prot = PAGE_READ | PAGE_WRITE;
        if (XRANGE(address, 0xF0000000, 0xFFFFFFFF)) {
            if (regime_sctlr(env, mmu_idx) & SCTLR_V) {
                /* hivecs execing is ok */
                *prot |= PAGE_EXEC;
            }
        } else if (XRANGE(address, 0x00000000, 0x7FFFFFFF)) {
            *prot |= PAGE_EXEC;
        }
    } else {
        /* Default system address map for M profile cores.
         * The architecture specifies which regions are execute-never;
         * at the MPU level no other checks are defined.
         */
        if (XRANGE(address, 0x00000000, 0x1fffffff) || /* ROM */
                XRANGE(address, 0x20000000, 0x3fffffff) || /* SRAM */
                XRANGE(address, 0x60000000, 0x7fffffff) || /* RAM */
                XRANGE(address, 0x80000000, 0x9fffffff)) /* RAM */
            *prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;

        else if (XRANGE(address, 0x40000000, 0x5fffffff) || /* Peripheral */
                XRANGE(address, 0xa0000000, 0xbfffffff) || /* Device */
                XRANGE(address, 0xc0000000, 0xdfffffff) || /* Device */
                XRANGE(address, 0xe0000000, 0xffffffff)) /* System */
            *prot = PAGE_READ | PAGE_WRITE;
    }
#undef XRANGE
}